

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_hmac_sha256(void)

{
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_hash_context_t *ppVar3;
  uint8_t digest [32];
  
  ppVar2 = find_aes128gcmsha256(ctx);
  ppVar3 = ptls_hmac_create(ppVar2->hash,"\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v",0x14);
  (*ppVar3->update)(ppVar3,"Hi There",8);
  (*ppVar3->final)(ppVar3,digest,PTLS_HASH_FINAL_MODE_FREE);
  iVar1 = bcmp(digest,anon_var_dwarf_9e9a,0x20);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x34);
  return;
}

Assistant:

static void test_hmac_sha256(void)
{
    /* test vector from RFC 4231 */
    const char *secret = "\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b\x0b", *message = "Hi There";
    uint8_t digest[32];

    ptls_hash_context_t *hctx = ptls_hmac_create(find_aes128gcmsha256(ctx)->hash, secret, strlen(secret));
    hctx->update(hctx, message, strlen(message));
    hctx->final(hctx, digest, 0);

    ok(memcmp(digest, "\xb0\x34\x4c\x61\xd8\xdb\x38\x53\x5c\xa8\xaf\xce\xaf\x0b\xf1\x2b\x88\x1d\xc2\x00\xc9\x83\x3d\xa7\x26\xe9\x37"
                      "\x6c\x2e\x32\xcf\xf7",
              32) == 0);
}